

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_apbe.c
# Opt level: O3

void gga_k_apbe_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  double __x;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  double *extraout_RDX;
  long lVar12;
  long in_RSI;
  long *plVar13;
  long *in_R8;
  double *pdVar14;
  ulong uVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  plVar13 = (long *)0x20;
  puVar9 = (undefined8 *)malloc(0x20);
  p->params = puVar9;
  uVar4 = p->info->number;
  uVar10 = (ulong)uVar4;
  if (uVar4 == 0x36) {
    uVar16 = 0x3fe9ba5e353f7cee;
  }
  else {
    if (uVar4 != 0x35) {
      gga_k_apbe_init_cold_1();
      if (in_RSI != 0) {
        lVar7 = plVar13[1];
        lVar8 = plVar13[9];
        lVar12 = 0;
        pdVar14 = extraout_RDX;
        do {
          dVar17 = *pdVar14;
          if ((int)lVar7 == 2) {
            dVar17 = dVar17 + pdVar14[1];
          }
          dVar1 = (double)plVar13[0x30];
          if (dVar1 <= dVar17) {
            dVar17 = *pdVar14;
            if (*pdVar14 <= dVar1) {
              dVar17 = dVar1;
            }
            dVar20 = 0.0;
            if (dVar1 < dVar17 * 0.5) {
              dVar1 = (double)plVar13[0x31];
              dVar21 = (double)plVar13[0x32] * (double)plVar13[0x32];
              dVar20 = *(double *)(uVar10 + *(int *)((long)plVar13 + 0x4c) * lVar12 * 8);
              if (dVar20 <= dVar21) {
                dVar20 = dVar21;
              }
              dVar21 = (double)(-(ulong)(dVar1 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar1 < 1.0) & (ulong)(dVar1 + -1.0 + 1.0));
              uVar15 = -(ulong)(dVar21 <= dVar1);
              __x = (double)(uVar15 & (ulong)dVar1 | ~uVar15 & (ulong)dVar21);
              dVar18 = cbrt(__x);
              pdVar5 = (double *)plVar13[0x2f];
              dVar1 = pdVar5[3];
              dVar21 = pdVar5[2];
              dVar2 = *pdVar5;
              dVar3 = pdVar5[1];
              dVar19 = cbrt(9.869604401089358);
              dVar22 = 1.0 / (dVar19 * dVar19);
              dVar19 = cbrt(dVar17);
              dVar17 = (1.0 / (dVar19 * dVar19)) / (dVar17 * dVar17);
              dVar23 = dVar20 * 1.5874010519681996 * dVar17;
              dVar20 = dVar19 * dVar19 * dVar18 * dVar18 * __x * 1.4356170000940958 *
                       ((1.0 - dVar2 / (((((1.0 / ((dVar3 * 1.8171205928321397 * dVar22 * dVar23) /
                                                   24.0 + 1.0)) * dVar17 *
                                          dVar22 * 1.8171205928321397 * (dVar21 - dVar1) * dVar3 *
                                          dVar20 * 1.5874010519681996) / 24.0 + dVar1) *
                                         1.8171205928321397 * dVar22 * dVar23) / 24.0 + dVar2)) *
                        dVar2 + 1.0);
              dVar20 = dVar20 + dVar20;
            }
            lVar6 = *in_R8;
            if ((lVar6 != 0) && ((*(byte *)(*plVar13 + 0x40) & 1) != 0)) {
              lVar11 = (int)plVar13[0xb] * lVar12;
              *(double *)(lVar6 + lVar11 * 8) = dVar20 + *(double *)(lVar6 + lVar11 * 8);
            }
          }
          lVar12 = lVar12 + 1;
          pdVar14 = pdVar14 + (int)lVar8;
        } while (in_RSI != lVar12);
      }
      return;
    }
    uVar16 = 0x3ff3eb851eb851ec;
  }
  *puVar9 = uVar16;
  puVar9[1] = 0x3ffaaaaaaaaaaaab;
  puVar9[2] = 0x3fce97396d0917d7;
  puVar9[3] = 0x3fc7b425ed097b42;
  return;
}

Assistant:

static void
gga_k_apbe_init(xc_func_type *p)
{
  gga_k_apbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_apbe_params));
  params = (gga_k_apbe_params *) (p->params);

  params->lambda = 0.0;

  switch(p->info->number){
  case XC_GGA_K_APBE:
    params->kappa = 0.8040;
    params->mu    = 0.23889;
    break;
  case XC_GGA_K_TW1:
    params->kappa = 0.8209;
    params->mu    = 0.2335;
    break;
  case XC_GGA_K_TW2:
    params->kappa = 0.6774;
    params->mu    = 0.2371;
    break;
  case XC_GGA_K_TW3:
    params->kappa = 0.8438;
    params->mu    = 0.2319;
    break;
  case XC_GGA_K_TW4:
    params->kappa = 0.8589;
    params->mu    = 0.2309;
    break;
  case XC_GGA_K_REVAPBE:
    params->kappa = 1.245;
    params->mu    = 0.23889;
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_apbe\n");
    exit(1);
  }
}